

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

int duckdb::Cast::Operation<duckdb::hugeint_t,int>(hugeint_t input)

{
  hugeint_t hVar1;
  bool bVar2;
  InvalidInputException *this;
  int64_t in_RSI;
  uint64_t in_RDI;
  int result;
  undefined1 in_stack_000001a0 [16];
  string local_48 [52];
  int local_14 [5];
  
  hVar1.upper = in_RSI;
  hVar1.lower = in_RDI;
  bVar2 = duckdb::TryCast::Operation<duckdb::hugeint_t,int>(hVar1,local_14,false);
  if (!bVar2) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::hugeint_t,int>((hugeint_t)in_stack_000001a0);
    duckdb::InvalidInputException::InvalidInputException(this,local_48);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_14[0];
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}